

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateFunctionDef
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *funcName)

{
  long lVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  lVar1 = std::__cxx11::string::find((char *)funcName,0x170023e);
  if (lVar1 == -1) {
    __s = 
    "    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n"
    ;
    __a = &local_a;
  }
  else {
    __s = 
    "    <FUNCTION>(uni_in,\n               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n               retValue<COMPONENT_DEF>);\n"
    ;
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateFunctionDef(std::string funcName)
{
	if (funcName.find("sparse", 0) != std::string::npos)
	{
		return std::string("    <FUNCTION>(uni_in,\n"
						   "               <POINT_COORD><SAMPLE_DEF><ARGUMENTS>,\n"
						   "               retValue<COMPONENT_DEF>);\n");
	}
	else
	{
		return std::string("    retValue<COMPONENT_DEF> = <FUNCTION>(uni_in,\n"
						   "                                         <POINT_COORD><SAMPLE_DEF><ARGUMENTS>);\n");
	}
}